

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O0

bool __thiscall dg::LLVMDependenceGraph::addFormalGlobal(LLVMDependenceGraph *this,Value *val)

{
  DGParameterPair<dg::LLVMNode> *pDVar1;
  _Base_ptr p_Var2;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_RDI;
  LLVMNode *gnode;
  Function *F;
  LLVMNode *entry;
  LLVMNode *fpout;
  LLVMNode *fpin;
  LLVMDGParameters *params;
  LLVMNode *in_stack_ffffffffffffff88;
  DGParameters<dg::LLVMNode> *in_stack_ffffffffffffff98;
  LLVMDependenceGraph *in_stack_ffffffffffffffa0;
  LLVMDependenceGraph *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0 [16];
  DGParameters<dg::LLVMNode> *in_stack_ffffffffffffffd0;
  bool local_1;
  
  getOrCreateParameters(in_stack_ffffffffffffffa0);
  pDVar1 = DGParameters<dg::LLVMNode>::find(in_stack_ffffffffffffff98,(KeyT)in_RDI);
  if (pDVar1 == (DGParameterPair<dg::LLVMNode> *)0x0) {
    DGParameters<dg::LLVMNode>::constructGlobal<llvm::Value*,dg::LLVMDependenceGraph*>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0._8_8_,
               in_stack_ffffffffffffffc0._0_8_,in_stack_ffffffffffffffb8);
    std::tie<dg::LLVMNode*,dg::LLVMNode*>
              ((LLVMNode **)in_stack_ffffffffffffff98,(LLVMNode **)in_RDI);
    std::tuple<dg::LLVMNode*&,dg::LLVMNode*&>::operator=
              ((tuple<dg::LLVMNode_*&,_dg::LLVMNode_*&> *)in_stack_ffffffffffffffa0,
               (pair<dg::LLVMNode_*,_dg::LLVMNode_*> *)in_stack_ffffffffffffff98);
    DependenceGraph<dg::LLVMNode>::getEntry((DependenceGraph<dg::LLVMNode> *)in_RDI);
    Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
              (in_RDI,in_stack_ffffffffffffff88);
    Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
              (in_RDI,in_stack_ffffffffffffff88);
    LLVMNode::getValue((LLVMNode *)0x17ce6e);
    p_Var2 = (_Base_ptr)llvm::dyn_cast<llvm::Function,llvm::Value>((Value *)in_RDI);
    if ((p_Var2 != (_Base_ptr)0x0) &&
       (p_Var2 == *(_Base_ptr *)
                   ((long)&(in_RDI->revControlDepEdges).super_DGContainer<dg::LLVMNode_*,_4U>.
                           container._M_t._M_impl.super__Rb_tree_header._M_header + 0x18))) {
      DependenceGraph<dg::LLVMNode>::getGlobalNode
                ((DependenceGraph<dg::LLVMNode> *)in_RDI,(KeyT)in_stack_ffffffffffffff88);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
                (in_RDI,in_stack_ffffffffffffff88);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool LLVMDependenceGraph::addFormalGlobal(llvm::Value *val) {
    // add the same formal parameters
    LLVMDGParameters *params = getOrCreateParameters();
    assert(params);

    // if we have this value, just return
    if (params->find(val))
        return false;

    LLVMNode *fpin, *fpout;
    std::tie(fpin, fpout) = params->constructGlobal(val, val, this);
    assert(fpin && fpout);
    assert(fpin->getDG() == this && fpout->getDG() == this);

    LLVMNode *entry = getEntry();
    entry->addControlDependence(fpin);
    entry->addControlDependence(fpout);

    // if these are the formal parameters of the main
    // function, add control dependence also between the
    // global as the formal input parameter representing this global
    if (llvm::Function *F = llvm::dyn_cast<llvm::Function>(entry->getValue())) {
        if (F == entryFunction) {
            auto *gnode = getGlobalNode(val);
            assert(gnode);
            gnode->addControlDependence(fpin);
        }
    }

    return true;
}